

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS
ref_grid_enclosing_tet(REF_GRID_conflict ref_grid,REF_DBL *xyz,REF_INT *tet,REF_DBL *bary)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  REF_CELL ref_cell;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int *piVar8;
  undefined8 uVar9;
  char *pcVar10;
  uint uVar11;
  uint unaff_R15D;
  REF_INT nodes [27];
  uint local_cc;
  uint *local_c8;
  REF_DBL *local_c0;
  REF_GRID_conflict local_b8;
  REF_NODE local_b0;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  REF_INT local_9c;
  
  local_b0 = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  local_cc = *tet;
  if ((((long)(int)local_cc < 0) || (ref_cell->max <= (int)local_cc)) ||
     (ref_cell->c2n[(long)ref_cell->size_per * (long)(int)local_cc] == -1)) {
    uVar11 = ref_cell->max;
    if ((int)uVar11 < 1) {
      uVar7 = 0;
    }
    else {
      piVar8 = ref_cell->c2n;
      uVar7 = 0;
      do {
        if (*piVar8 != -1) goto LAB_0014bcc6;
        uVar7 = uVar7 + 1;
        piVar8 = piVar8 + ref_cell->size_per;
      } while (uVar11 != uVar7);
      uVar7 = (ulong)uVar11;
    }
LAB_0014bcc6:
    local_cc = (uint)uVar7;
  }
  uVar11 = 0;
  local_c8 = (uint *)tet;
  local_c0 = xyz;
  local_b8 = ref_grid;
  do {
    uVar6 = local_cc;
    if ((((long)(int)local_cc < 0) || (ref_cell->max <= (int)local_cc)) ||
       (ref_cell->c2n[(long)ref_cell->size_per * (long)(int)local_cc] == -1)) {
      uVar11 = ref_grid_exhaustive_enclosing_tet(local_b8,local_c0,(REF_INT *)local_c8,bary);
      if (uVar11 == 0) goto LAB_0014c1a8;
      uVar9 = 0x39f;
      goto LAB_0014c194;
    }
    uVar5 = ref_cell_nodes(ref_cell,local_cc,&local_a8);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x3a3,
             "ref_grid_enclosing_tet",(ulong)uVar5,"cell");
      return uVar5;
    }
    uVar5 = ref_node_bary4(local_b0,&local_a8,local_c0,bary);
    if ((uVar5 & 0xfffffffb) != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x3a4,
             "ref_grid_enclosing_tet",(ulong)uVar5,"bary");
      unaff_R15D = uVar5;
    }
    if ((uVar5 & 0xfffffffb) != 0) {
      return unaff_R15D;
    }
    if (0x3de < uVar11) {
      printf("step %d, tet %d, bary %e %e %e %e inside %e\n",*bary,bary[1],bary[2],bary[3],
             0xbd719799812dea11,(ulong)uVar11,(ulong)uVar6);
    }
    dVar1 = *bary;
    if (((-1e-12 <= dVar1) && (-1e-12 <= bary[1])) && ((-1e-12 <= bary[2] && (-1e-12 <= bary[3]))))
    {
      *local_c8 = uVar6;
      goto LAB_0014c1a8;
    }
    dVar2 = bary[1];
    if (((dVar2 <= dVar1) || (bary[2] <= dVar1)) || (bary[3] <= dVar1)) {
      if (((dVar1 <= dVar2) || (bary[3] <= dVar2)) || (bary[2] <= dVar2)) {
        dVar3 = bary[2];
        if (((dVar1 <= dVar3) || (dVar2 <= dVar3)) || (bary[3] <= dVar3)) {
          dVar4 = bary[3];
          if (((dVar2 <= dVar4) || (dVar1 <= dVar4)) || (dVar3 <= dVar4)) {
            if (((dVar2 < dVar1) || (dVar3 < dVar1)) || (dVar4 < dVar1)) {
              if (((dVar3 < dVar2) || (dVar1 < dVar2)) || (dVar4 < dVar2)) {
                if (((dVar1 < dVar3) || (dVar2 < dVar3)) || (dVar4 < dVar3)) {
                  if (((dVar2 < dVar4) || (dVar1 < dVar4)) || (dVar3 < dVar4)) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                           ,0x3e3,"ref_grid_enclosing_tet","unable to find the next step");
                    return 1;
                  }
                  uVar6 = ref_update_tet_guess
                                    (ref_cell,local_a8,local_a0,local_a4,(REF_INT *)&local_cc);
                  if (uVar6 != 0) {
                    uVar9 = 0x3df;
                    goto LAB_0014bf80;
                  }
                }
                else {
                  uVar6 = ref_update_tet_guess
                                    (ref_cell,local_a8,local_a4,local_9c,(REF_INT *)&local_cc);
                  if (uVar6 != 0) {
                    uVar9 = 0x3d9;
                    goto LAB_0014bf1c;
                  }
                }
              }
              else {
                uVar6 = ref_update_tet_guess
                                  (ref_cell,local_a8,local_9c,local_a0,(REF_INT *)&local_cc);
                if (uVar6 != 0) {
                  uVar9 = 0x3d3;
                  goto LAB_0014c037;
                }
              }
            }
            else {
              uVar6 = ref_update_tet_guess(ref_cell,local_a4,local_a0,local_9c,(REF_INT *)&local_cc)
              ;
              if (uVar6 != 0) {
                uVar9 = 0x3cd;
                goto LAB_0014bfdf;
              }
            }
          }
          else {
            uVar6 = ref_update_tet_guess(ref_cell,local_a8,local_a0,local_a4,(REF_INT *)&local_cc);
            if (uVar6 != 0) {
              uVar9 = 0x3c6;
LAB_0014bf80:
              uVar7 = (ulong)uVar6;
              pcVar10 = "update 0 2 1";
              goto LAB_0014c048;
            }
          }
        }
        else {
          uVar6 = ref_update_tet_guess(ref_cell,local_a8,local_a4,local_9c,(REF_INT *)&local_cc);
          if (uVar6 != 0) {
            uVar9 = 0x3c0;
LAB_0014bf1c:
            uVar7 = (ulong)uVar6;
            pcVar10 = "update 0 1 3";
            goto LAB_0014c048;
          }
        }
      }
      else {
        uVar6 = ref_update_tet_guess(ref_cell,local_a8,local_9c,local_a0,(REF_INT *)&local_cc);
        if (uVar6 != 0) {
          uVar9 = 0x3ba;
LAB_0014c037:
          uVar7 = (ulong)uVar6;
          pcVar10 = "update 0 3 2";
          goto LAB_0014c048;
        }
      }
    }
    else {
      uVar6 = ref_update_tet_guess(ref_cell,local_a4,local_a0,local_9c,(REF_INT *)&local_cc);
      if (uVar6 != 0) {
        uVar9 = 0x3b4;
LAB_0014bfdf:
        uVar7 = (ulong)uVar6;
        pcVar10 = "update 1 2 3";
LAB_0014c048:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               uVar9,"ref_grid_enclosing_tet",uVar7,pcVar10);
        unaff_R15D = uVar6;
      }
    }
    if (uVar6 != 0) {
      return unaff_R15D;
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 1000);
  uVar11 = ref_grid_exhaustive_enclosing_tet(local_b8,local_c0,(REF_INT *)local_c8,bary);
  if (uVar11 == 0) {
LAB_0014c1a8:
    uVar11 = 0;
  }
  else {
    uVar9 = 999;
LAB_0014c194:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar9,
           "ref_grid_enclosing_tet",(ulong)uVar11,"enclose");
  }
  return uVar11;
}

Assistant:

REF_FCN REF_STATUS ref_grid_enclosing_tet(REF_GRID ref_grid, REF_DBL *xyz,
                                          REF_INT *tet, REF_DBL *bary) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT guess;
  REF_DBL inside;
  REF_INT step, limit;

  guess = *tet;
  if (!ref_cell_valid(ref_cell, guess)) {
    each_ref_cell_valid_cell(ref_cell, guess) { break; }
  }

  limit = 1000;      /* was 10e6^(1/3), required 108 for twod testcase  */
  inside = -1.0e-12; /* initial inside tolerance  */

  for (step = 0; step < limit; step++) {
    /* exhaustive search if cell is invalid */
    if (!ref_cell_valid(ref_cell, guess)) {
      RSS(ref_grid_exhaustive_enclosing_tet(ref_grid, xyz, tet, bary),
          "enclose");
      return REF_SUCCESS;
    }

    RSS(ref_cell_nodes(ref_cell, guess, nodes), "cell");
    RXS(ref_node_bary4(ref_node, nodes, xyz, bary), REF_DIV_ZERO, "bary");

    if (step > 990) {
      printf("step %d, tet %d, bary %e %e %e %e inside %e\n", step, guess,
             bary[0], bary[1], bary[2], bary[3], inside);
    }

    if (bary[0] >= inside && bary[1] >= inside && bary[2] >= inside &&
        bary[3] >= inside) {
      *tet = guess;
      return REF_SUCCESS;
    }

    /* less than */
    if (bary[0] < bary[1] && bary[0] < bary[2] && bary[0] < bary[3]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[1], nodes[2], nodes[3], &guess),
          "update 1 2 3");
      continue;
    }

    if (bary[1] < bary[0] && bary[1] < bary[3] && bary[1] < bary[2]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[0], nodes[3], nodes[2], &guess),
          "update 0 3 2");
      continue;
    }

    if (bary[2] < bary[0] && bary[2] < bary[1] && bary[2] < bary[3]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[0], nodes[1], nodes[3], &guess),
          "update 0 1 3");
      continue;
    }

    if (bary[3] < bary[0] && bary[3] < bary[2] && bary[3] < bary[1]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[0], nodes[2], nodes[1], &guess),
          "update 0 2 1");
      continue;
    }

    /* less than or equal */
    if (bary[0] <= bary[1] && bary[0] <= bary[2] && bary[0] <= bary[3]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[1], nodes[2], nodes[3], &guess),
          "update 1 2 3");
      continue;
    }

    if (bary[1] <= bary[0] && bary[1] <= bary[3] && bary[1] <= bary[2]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[0], nodes[3], nodes[2], &guess),
          "update 0 3 2");
      continue;
    }

    if (bary[2] <= bary[0] && bary[2] <= bary[1] && bary[2] <= bary[3]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[0], nodes[1], nodes[3], &guess),
          "update 0 1 3");
      continue;
    }

    if (bary[3] <= bary[0] && bary[3] <= bary[2] && bary[3] <= bary[1]) {
      RSS(ref_update_tet_guess(ref_cell, nodes[0], nodes[2], nodes[1], &guess),
          "update 0 2 1");
      continue;
    }

    THROW("unable to find the next step");
  }

  /* exhaustive search when walk runs out of iterations */
  RSS(ref_grid_exhaustive_enclosing_tet(ref_grid, xyz, tet, bary), "enclose");

  return REF_SUCCESS;
}